

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::ServiceDescriptorProto::ServiceDescriptorProto
          (ServiceDescriptorProto *this,ServiceDescriptorProto *from)

{
  bool bVar1;
  ArenaStringPtr *this_00;
  string *psVar2;
  Arena *default_value;
  ServiceOptions *pSVar3;
  ServiceDescriptorProto *in_RSI;
  ServiceDescriptorProto *in_RDI;
  Arena *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  RepeatedPtrField<google::protobuf::MethodDescriptorProto> *in_stack_ffffffffffffff28;
  RepeatedPtrField<google::protobuf::MethodDescriptorProto> *in_stack_ffffffffffffff30;
  ServiceOptions *in_stack_ffffffffffffff68;
  ServiceOptions *in_stack_ffffffffffffff70;
  
  Message::Message((Message *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  (in_RDI->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__ServiceDescriptorProto_00958870;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            ((InternalMetadataWithArena *)
             CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),in_stack_ffffffffffffff18
            );
  (in_RDI->_has_bits_).has_bits_[0] = (in_RSI->_has_bits_).has_bits_[0];
  internal::CachedSize::CachedSize((CachedSize *)0x512d2b);
  RepeatedPtrField<google::protobuf::MethodDescriptorProto>::RepeatedPtrField
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  pSVar3 = (ServiceOptions *)&in_RSI->_internal_metadata_;
  if (((uint)(((InternalMetadataWithArena *)pSVar3)->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    if (((uint)(((InternalMetadataWithArena *)pSVar3)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)pSVar3);
      in_stack_ffffffffffffff70 = pSVar3;
    }
    else {
      in_stack_ffffffffffffff68 =
           (ServiceOptions *)internal::InternalMetadataWithArena::default_instance();
      in_stack_ffffffffffffff70 = pSVar3;
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              ((InternalMetadataWithArena *)
               CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (UnknownFieldSet *)in_stack_ffffffffffffff18);
  }
  this_00 = &in_RDI->name_;
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault(this_00,psVar2);
  bVar1 = _internal_has_name(in_RSI);
  if (bVar1) {
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    psVar2 = _internal_name_abi_cxx11_((ServiceDescriptorProto *)0x512ece);
    default_value =
         GetArenaNoVirtual((ServiceDescriptorProto *)
                           CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
    internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)psVar2,(string *)default_value,
               (string *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
  }
  bVar1 = _internal_has_options(in_RDI);
  if (bVar1) {
    pSVar3 = (ServiceOptions *)operator_new(0x50);
    ServiceOptions::ServiceOptions(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    in_RDI->options_ = pSVar3;
  }
  else {
    in_RDI->options_ = (ServiceOptions *)0x0;
  }
  return;
}

Assistant:

ServiceDescriptorProto::ServiceDescriptorProto(const ServiceDescriptorProto& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _internal_metadata_(nullptr),
      _has_bits_(from._has_bits_),
      method_(from.method_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_name()) {
    name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_name(),
      GetArenaNoVirtual());
  }
  if (from._internal_has_options()) {
    options_ = new PROTOBUF_NAMESPACE_ID::ServiceOptions(*from.options_);
  } else {
    options_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:google.protobuf.ServiceDescriptorProto)
}